

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *p,Gia_Obj_t *pObj1,Gia_Obj_t *pObj2)

{
  Cec_ParSat_t *pCVar1;
  sat_solver *s;
  ABC_INT64_T AVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  abctime aVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pObj;
  undefined8 local_40;
  long local_38;
  
  iVar7 = 1;
  if ((((Gia_Obj_t *)((ulong)pObj2 ^ 1) != pObj1) && (pGVar9 = p->pAig->pObjs, pGVar9 != pObj1)) &&
     (pGVar9 != pObj2)) {
    pCVar1 = p->pPars;
    local_38 = (long)pCVar1->nBTLimit;
    if (((Gia_Obj_t *)((ulong)pGVar9 ^ 1) == pObj1) &&
       ((pObj2 == (Gia_Obj_t *)0x0 || (pObj1 == pObj2)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                    ,0x245,"int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    pGVar9 = (Gia_Obj_t *)((ulong)pObj1 & 0xfffffffffffffffe);
    iVar3 = p->nCallsSince;
    p->nCallsSince = iVar3 + 1;
    p->nSatTotal = p->nSatTotal + 1;
    pObj = (Gia_Obj_t *)((ulong)pObj2 & 0xfffffffffffffffe);
    if ((p->pSat == (sat_solver *)0x0) ||
       (((pCVar1->nSatVarMax != 0 && (pCVar1->nSatVarMax < p->nSatVars)) &&
        (pCVar1->nCallsRecycle <= iVar3)))) {
      Cec_ManSatSolverRecycle(p);
    }
    Abc_Clock();
    Cec_CnfNodeAddToSolver(p,pGVar9);
    Cec_CnfNodeAddToSolver(p,pObj);
    Abc_Clock();
    s = p->pSat;
    if (s->qtail != s->qhead) {
      iVar3 = sat_solver_simplify(s);
      if (iVar3 == 0) {
        __assert_fail("status != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                      ,0x263,"int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *, Gia_Obj_t *, Gia_Obj_t *)")
        ;
      }
      if (p->pSat->qtail != p->pSat->qhead) {
        __assert_fail("p->pSat->qtail == p->pSat->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                      ,0x264,"int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *, Gia_Obj_t *, Gia_Obj_t *)")
        ;
      }
    }
    iVar3 = Cec_ObjSatNum(p,pGVar9);
    iVar3 = ((uint)pObj1 & 1) + iVar3 * 2;
    local_40 = CONCAT44(local_40._4_4_,iVar3);
    iVar4 = Cec_ObjSatNum(p,pObj);
    iVar4 = ((uint)pObj2 & 1) + iVar4 * 2;
    local_40 = CONCAT44(iVar4,(lit)local_40);
    if (p->pPars->fPolarFlip != 0) {
      if (*(long *)pGVar9 < 0) {
        local_40 = CONCAT44(iVar4,iVar3) ^ 1;
      }
      if (*(long *)pObj < 0) {
        local_40 = CONCAT44(iVar4,(lit)local_40) ^ 0x100000000;
      }
    }
    aVar5 = Abc_Clock();
    AVar2 = (p->pSat->stats).conflicts;
    Abc_Clock();
    iVar3 = sat_solver_solve(p->pSat,(lit *)&local_40,(lit *)&local_38,local_38,0,0,0);
    aVar6 = Abc_Clock();
    iVar4 = (int)aVar6 - (int)aVar5;
    iVar8 = (int)AVar2;
    if (iVar3 == 1) {
      p->timeSatSat = p->timeSatSat + iVar4;
      p->nSatSat = p->nSatSat + 1;
      p->nConfSat = p->nConfSat + ((int)(p->pSat->stats).conflicts - iVar8);
      iVar7 = 0;
    }
    else if (iVar3 == -1) {
      p->timeSatUnsat = p->timeSatUnsat + iVar4;
      local_40 = local_40 ^ 0x100000001;
      iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_40,(lit *)&local_38);
      if (iVar3 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                      ,0x27f,"int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *, Gia_Obj_t *, Gia_Obj_t *)")
        ;
      }
      p->nSatUnsat = p->nSatUnsat + 1;
      p->nConfUnsat = p->nConfUnsat + ((int)(p->pSat->stats).conflicts - iVar8);
    }
    else {
      p->timeSatUndec = p->timeSatUndec + iVar4;
      p->nSatUndec = p->nSatUndec + 1;
      p->nConfUndec = p->nConfUndec + ((int)(p->pSat->stats).conflicts - iVar8);
      iVar7 = -1;
    }
  }
  return iVar7;
}

Assistant:

int Cec_ManSatCheckNodeTwo( Cec_ManSat_t * p, Gia_Obj_t * pObj1, Gia_Obj_t * pObj2 )
{
    Gia_Obj_t * pObjR1 = Gia_Regular(pObj1);
    Gia_Obj_t * pObjR2 = Gia_Regular(pObj2);
    int nBTLimit = p->pPars->nBTLimit;
    int Lits[2], RetValue, status, nConflicts;
    abctime clk, clk2;

    if ( pObj1 == Gia_ManConst0(p->pAig) || pObj2 == Gia_ManConst0(p->pAig) || pObj1 == Gia_Not(pObj2) )
        return 1;
    if ( pObj1 == Gia_ManConst1(p->pAig) && (pObj2 == NULL || pObj2 == Gia_ManConst1(p->pAig)) )
    {
        assert( 0 );
        return 0;
    }

    p->nCallsSince++;  // experiment with this!!!
    p->nSatTotal++;
    
    // check if SAT solver needs recycling
    if ( p->pSat == NULL || 
        (p->pPars->nSatVarMax && 
         p->nSatVars > p->pPars->nSatVarMax && 
         p->nCallsSince > p->pPars->nCallsRecycle) )
        Cec_ManSatSolverRecycle( p );

    // if the nodes do not have SAT variables, allocate them
clk2 = Abc_Clock();
    Cec_CnfNodeAddToSolver( p, pObjR1 );
    Cec_CnfNodeAddToSolver( p, pObjR2 );
//ABC_PRT( "cnf", Abc_Clock() - clk2 );
//Abc_Print( 1, "%d \n", p->pSat->size );

clk2 = Abc_Clock();
//    Cec_SetActivityFactors( p, pObjR1 ); 
//    Cec_SetActivityFactors( p, pObjR2 ); 
//ABC_PRT( "act", Abc_Clock() - clk2 );

    // propage unit clauses
    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    Lits[0] = toLitCond( Cec_ObjSatNum(p,pObjR1), Gia_IsComplement(pObj1) );
    Lits[1] = toLitCond( Cec_ObjSatNum(p,pObjR2), Gia_IsComplement(pObj2) );
    if ( p->pPars->fPolarFlip )
    {
        if ( pObjR1->fPhase )  Lits[0] = lit_neg( Lits[0] );
        if ( pObjR2->fPhase )  Lits[1] = lit_neg( Lits[1] );
    }
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
clk = Abc_Clock();
    nConflicts = p->pSat->stats.conflicts;

clk2 = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, Lits, Lits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//ABC_PRT( "sat", Abc_Clock() - clk2 );

    if ( RetValue == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        Lits[0] = lit_neg( Lits[0] );
        Lits[1] = lit_neg( Lits[1] );
        RetValue = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
        assert( RetValue );
        p->nSatUnsat++;
        p->nConfUnsat += p->pSat->stats.conflicts - nConflicts;       
//Abc_Print( 1, "UNSAT after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return 1;
    }
    else if ( RetValue == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nSatSat++;
        p->nConfSat += p->pSat->stats.conflicts - nConflicts;
//Abc_Print( 1, "SAT after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return 0;
    }
    else // if ( RetValue == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nSatUndec++;
        p->nConfUndec += p->pSat->stats.conflicts - nConflicts;
//Abc_Print( 1, "UNDEC after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return -1;
    }
}